

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicRMW
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,AtomicRMW *curr)

{
  bool bVar1;
  bool local_39;
  BasicType local_20 [2];
  AtomicRMW *local_18;
  AtomicRMW *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  local_20[1] = 2;
  local_18 = curr;
  curr_local = (AtomicRMW *)this;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                      type,local_20 + 1);
  local_39 = true;
  if (!bVar1) {
    local_20[0] = i64;
    local_39 = wasm::Type::operator==
                         (&(local_18->super_SpecificExpression<(wasm::Expression::Id)24>).
                           super_Expression.type,local_20);
  }
  if (local_39 == false) {
    __assert_fail("curr->type == Type::i32 || curr->type == Type::i64",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,200,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicRMW(AtomicRMW *) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  notePointer(this,&local_18->ptr,(Name)(local_18->memory).super_IString.str);
  note(this,&local_18->value,
       (Type)(local_18->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id
      );
  return;
}

Assistant:

void visitAtomicRMW(AtomicRMW* curr) {
    assert(curr->type == Type::i32 || curr->type == Type::i64);
    notePointer(&curr->ptr, curr->memory);
    note(&curr->value, curr->type);
  }